

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

void mgf_mask(uchar *dst,size_t dlen,uchar *src,size_t slen,mbedtls_md_context_t *md_ctx)

{
  byte bVar1;
  uchar *local_a0;
  size_t use_len;
  size_t i;
  byte *pbStack_88;
  uint hlen;
  uchar *p;
  byte local_78 [4];
  uchar counter [4];
  uchar mask [64];
  mbedtls_md_context_t *md_ctx_local;
  size_t slen_local;
  uchar *src_local;
  size_t dlen_local;
  uchar *dst_local;
  
  memset(local_78,0,0x40);
  memset((void *)((long)&p + 4),0,4);
  bVar1 = mbedtls_md_get_size(md_ctx->md_info);
  pbStack_88 = dst;
  for (src_local = (uchar *)dlen; src_local != (uchar *)0x0; src_local = src_local + -(long)local_a0
      ) {
    local_a0 = (uchar *)(ulong)(uint)bVar1;
    if (src_local < (uchar *)(ulong)(uint)bVar1) {
      local_a0 = src_local;
    }
    mbedtls_md_starts(md_ctx);
    mbedtls_md_update(md_ctx,src,slen);
    mbedtls_md_update(md_ctx,(uchar *)((long)&p + 4),4);
    mbedtls_md_finish(md_ctx,local_78);
    for (use_len = 0; use_len < local_a0; use_len = use_len + 1) {
      *pbStack_88 = *pbStack_88 ^ local_78[use_len];
      pbStack_88 = pbStack_88 + 1;
    }
    p._7_1_ = p._7_1_ + '\x01';
  }
  return;
}

Assistant:

static void mgf_mask( unsigned char *dst, size_t dlen, unsigned char *src,
                      size_t slen, mbedtls_md_context_t *md_ctx )
{
    unsigned char mask[MBEDTLS_MD_MAX_SIZE];
    unsigned char counter[4];
    unsigned char *p;
    unsigned int hlen;
    size_t i, use_len;

    memset( mask, 0, MBEDTLS_MD_MAX_SIZE );
    memset( counter, 0, 4 );

    hlen = mbedtls_md_get_size( md_ctx->md_info );

    /* Generate and apply dbMask */
    p = dst;

    while( dlen > 0 )
    {
        use_len = hlen;
        if( dlen < hlen )
            use_len = dlen;

        mbedtls_md_starts( md_ctx );
        mbedtls_md_update( md_ctx, src, slen );
        mbedtls_md_update( md_ctx, counter, 4 );
        mbedtls_md_finish( md_ctx, mask );

        for( i = 0; i < use_len; ++i )
            *p++ ^= mask[i];

        counter[3]++;

        dlen -= use_len;
    }
}